

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fColorClearTest.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::ColorClearCase::iterate(ColorClearCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint width;
  uint height;
  TestLog *this_00;
  RenderContext *context;
  TestContext *this_01;
  char cVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  int iVar10;
  RGBA RVar11;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  ostream *poVar13;
  uint uVar14;
  undefined4 uVar15;
  Surface *pSVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  IterateResult IVar17;
  ChannelOrder CVar18;
  uint uVar19;
  ChannelOrder CVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  RGBA thr;
  long lVar27;
  long lVar28;
  uint uVar29;
  ChannelType CVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  clearOps;
  Surface resImage;
  Surface refImage;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelKnownChannelMask;
  Surface diffImage;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  scanlineClearOps;
  int local_4ec;
  string local_4c8;
  uint local_4a4;
  uint local_4a0;
  int local_49c;
  ChannelOrder local_498;
  ChannelType local_494;
  uint local_490;
  uint local_48c;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  local_488;
  Surface local_468;
  string local_450;
  Surface local_430;
  deRandom local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_408;
  string local_3f0;
  string local_3d0;
  Surface local_3b0;
  LogImageSet local_398;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  LogImage local_2d8;
  LogImage local_248;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar27 = CONCAT44(extraout_var,iVar4);
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar12->m_width;
  height = pRVar12->m_height;
  uVar5 = ((uint)this->m_curIter >> 0x10 ^ this->m_curIter ^ 0x3d) * 9;
  uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
  deRandom_init(&local_418,uVar5 >> 0xf ^ uVar5);
  local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_408,(long)(int)(height * width),local_1b8,(allocator_type *)&local_2d8);
  tcu::Surface::Surface(&local_430,width,height);
  tcu::Surface::Surface(&local_468,width,height);
  tcu::Surface::Surface(&local_3b0,width,height);
  dVar6 = deRandom_getUint32(&local_418);
  local_49c = this->m_numClearsMin;
  iVar4 = this->m_numClearsMax;
  local_488.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_testScissoring == true) {
    (**(code **)(lVar27 + 0x5e0))(0xc11);
  }
  local_49c = dVar6 % ((iVar4 - local_49c) + 1U) + local_49c;
  if (0 < local_49c) {
    local_4a0 = width * 2;
    local_4a4 = height * 2;
    local_4ec = 0;
    do {
      CVar30 = SNORM_INT8;
      CVar18 = R;
      uVar5 = width;
      uVar29 = height;
      if ((this->m_testScissoring == true) &&
         ((local_4ec != 0 || (this->m_firstClearFull == false)))) {
        dVar6 = deRandom_getUint32(&local_418);
        uVar5 = dVar6 % local_4a0;
        dVar6 = deRandom_getUint32(&local_418);
        uVar29 = dVar6 % local_4a4;
        dVar6 = deRandom_getUint32(&local_418);
        dVar7 = deRandom_getUint32(&local_418);
        CVar18 = uVar5 - width;
        CVar30 = uVar29 - height;
        uVar5 = dVar6 % width;
        uVar29 = dVar7 % height;
      }
      local_490 = uVar29;
      local_48c = uVar5;
      (**(code **)(lVar27 + 0x1290))(CVar18,CVar30,uVar5);
      dVar6 = deRandom_getUint32(&local_418);
      dVar7 = deRandom_getUint32(&local_418);
      local_494 = CVar30;
      dVar8 = deRandom_getUint32(&local_418);
      uVar5 = 0xff;
      if (this->m_testAlpha == true) {
        dVar9 = deRandom_getUint32(&local_418);
        uVar5 = dVar9 & 0xff;
      }
      local_498 = CVar18;
      (**(code **)(lVar27 + 0x1c0))
                ((float)(dVar6 & 0xff) / 255.0,(float)(dVar7 & 0xff) / 255.0,
                 (float)(dVar8 & 0xff) / 255.0,(float)uVar5 / 255.0);
      uVar22 = 0xf;
      if ((this->m_testColorMasks == true) &&
         ((local_4ec != 0 || (this->m_firstClearFull == false)))) {
        dVar9 = deRandom_getUint32(&local_418);
        uVar22 = (ulong)dVar9 & 0xffffffffffffff0f;
      }
      bVar24 = (byte)uVar22;
      (**(code **)(lVar27 + 0x238))(bVar24 & 1,(byte)(uVar22 >> 1) & 1,bVar24 >> 2 & 1,7 < bVar24);
      (**(code **)(lVar27 + 0x188))(0x4000);
      local_1b8._4_4_ = local_494;
      local_1b8._0_4_ = local_498;
      uStack_1b0 = (pointer)CONCAT44(local_490,local_48c);
      local_1a8._M_allocated_capacity._0_1_ = bVar24;
      local_1a8._M_allocated_capacity._4_4_ =
           (dVar8 & 0xff) << 0x10 | (dVar7 & 0xff) << 8 | uVar5 << 0x18 | dVar6 & 0xff;
      std::
      vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
      ::emplace_back<deqp::gles3::Functional::ClearInfo>(&local_488,(ClearInfo *)local_1b8);
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      local_4ec = local_4ec + 1;
    } while (local_4ec < local_49c);
  }
  if (0 < (int)height) {
    iVar4 = 0;
    uVar5 = 0;
    do {
      local_1b8._0_4_ = R;
      local_1b8._4_4_ = SNORM_INT8;
      uStack_1b0 = (pointer)0x0;
      local_1a8._M_allocated_capacity = 0;
      if (0 < (int)((ulong)((long)local_488.
                                  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_488.
                                 super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar31 = 0;
        lVar28 = 0;
        do {
          iVar10 = *(int *)((long)((local_488.
                                    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data +
                           lVar31 + 4);
          if ((iVar10 <= (int)uVar5) &&
             ((int)uVar5 <
              iVar10 + *(int *)((long)((local_488.
                                        super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data +
                               lVar31 + 0xc))) {
            std::
            vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
            ::push_back((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                         *)local_1b8,
                        (value_type *)
                        ((long)((local_488.
                                 super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_rect).m_data + lVar31
                        ));
          }
          lVar28 = lVar28 + 1;
          lVar31 = lVar31 + 0x18;
        } while (lVar28 < (int)((ulong)((long)local_488.
                                              super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_488.
                                             super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (0 < (int)width) {
        iVar10 = 0;
        do {
          uVar14 = width - iVar10;
          uVar21 = (int)((ulong)((long)uStack_1b0 - (long)local_1b8) >> 3) * -0x55555555;
          uVar29 = 0;
          bVar24 = 0;
          do {
            uVar21 = uVar21 - 1;
            if ((int)uVar21 < 0) break;
            uVar22 = (ulong)uVar21;
            iVar23 = *(int *)((long)local_1b8 + uVar22 * 0x18);
            if ((iVar10 < iVar23) ||
               (iVar25 = *(int *)((char *)((long)local_1b8 + 8) + uVar22 * 0x18) + iVar23,
               uVar26 = iVar25 - iVar10, uVar26 == 0 || iVar25 < iVar10)) {
LAB_00688023:
              bVar33 = true;
              uVar26 = iVar23 - iVar10;
              if ((uVar26 != 0 && iVar10 <= iVar23) && ((int)uVar26 <= (int)uVar14)) {
                uVar14 = uVar26;
              }
            }
            else {
              lVar28 = (long)local_1b8 + uVar22 * 0x18;
              if (((int)uVar5 < *(int *)(lVar28 + 4)) ||
                 (*(int *)(lVar28 + 4) + *(int *)(lVar28 + 0xc) <= (int)uVar5)) goto LAB_00688023;
              if ((int)uVar26 <= (int)uVar14) {
                uVar14 = uVar26;
              }
              uVar26 = *(uint *)(lVar28 + 0x14);
              uVar19 = uVar29 & 0xffffff00 | uVar26 & 0xff;
              if ((bVar24 & 1) != 0) {
                uVar19 = uVar29;
              }
              bVar2 = *(byte *)(lVar28 + 0x10);
              if ((bVar2 & 1) == 0) {
                uVar19 = uVar29;
              }
              uVar29 = uVar19 & 0xffff00ff | uVar26 & 0xff00;
              if ((bVar24 & 2) != 0) {
                uVar29 = uVar19;
              }
              if ((bVar2 & 2) == 0) {
                uVar29 = uVar19;
              }
              uVar19 = uVar29 & 0xff00ffff | uVar26 & 0xff0000;
              if ((bVar24 & 4) != 0) {
                uVar19 = uVar29;
              }
              if ((bVar2 & 4) == 0) {
                uVar19 = uVar29;
              }
              uVar29 = uVar19 & 0xffffff | uVar26 & 0xff000000;
              if ((bVar24 & 8) != 0) {
                uVar29 = uVar19;
              }
              if ((bVar2 & 8) == 0) {
                uVar29 = uVar19;
              }
              bVar24 = bVar2 | bVar24;
              bVar33 = bVar24 != 0xf;
            }
          } while (bVar33);
          uVar21 = uVar29 | 0xff000000;
          if ((pRVar12->m_pixelFormat).alphaBits != 0) {
            uVar21 = uVar29;
          }
          if (0 < (int)uVar14) {
            uVar22 = (ulong)uVar14;
            iVar23 = iVar10;
            do {
              *(uint *)((long)local_430.m_pixels.m_ptr +
                       (long)(int)(local_430.m_width * uVar5 + iVar23) * 4) = uVar21;
              local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4 + iVar23] =
                   local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar4 + iVar23] | bVar24;
              iVar23 = iVar23 + 1;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          iVar10 = iVar10 + uVar14;
        } while (iVar10 < (int)width);
      }
      if ((TextureFormat)local_1b8 != (TextureFormat)0x0) {
        operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + width;
    } while (uVar5 != height);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d8.m_name._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_468.m_pixels.m_cap != (void *)0x0) {
    local_468.m_pixels.m_cap = (size_t)local_468.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_2d8,local_468.m_width,
             local_468.m_height,1,(void *)local_468.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b8);
  dVar6 = (**(code **)(lVar27 + 0x800))();
  glu::checkError(dVar6,"glReadPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fColorClearTest.cpp"
                  ,0xe9);
  iVar4 = (pRVar12->m_pixelFormat).alphaBits;
  bVar24 = 8 - (char)(pRVar12->m_pixelFormat).redBits;
  uVar5 = 0;
  if (0 < iVar4) {
    uVar5 = 0x1000000 << (8U - (char)iVar4 & 0x1f);
  }
  iVar4 = (pRVar12->m_pixelFormat).greenBits;
  iVar10 = (pRVar12->m_pixelFormat).blueBits;
  cVar3 = (**(code **)(lVar27 + 0xc70))(0xbd0);
  thr.m_value = 0x100 << (8U - (char)iVar4 & 0x1f) | 0x10000 << (8U - (char)iVar10 & 0x1f) | uVar5 |
                1 << (bVar24 & 0x1f);
  if (cVar3 != '\0') {
    uVar5 = thr.m_value & 0xffffff00 | (1 << (bVar24 & 0x1f) & 0xffU) + 1;
    uVar5 = (uVar5 & 0xff00) + 0x100 | uVar5 & 0xffff00ff;
    thr.m_value = ((uVar5 & 0xff0000) + 0x10000 | uVar5 & 0xff00ffff) + 0x1000000;
  }
  if ((int)height < 1) {
    bVar24 = 1;
    uVar5 = 0;
  }
  else {
    bVar24 = 1;
    lVar27 = 0;
    uVar29 = 0;
    uVar22 = 0;
    do {
      if (0 < (int)width) {
        uVar32 = 0;
        do {
          iVar4 = (int)uVar32;
          RVar11 = tcu::computeAbsDiffMasked
                             (*(deUint32 *)
                               ((long)local_430.m_pixels.m_ptr +
                               (long)(int)(local_430.m_width * uVar29 + iVar4) * 4),
                              *(deUint32 *)
                               ((long)local_468.m_pixels.m_ptr +
                               (long)(int)(local_468.m_width * uVar29 + iVar4) * 4),
                              (uint)local_408.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)lVar27 + iVar4]);
          local_1b8._0_4_ = RVar11.m_value;
          bVar33 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b8,thr);
          uVar15 = 0xff0000ff;
          if (bVar33) {
            uVar15 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_3b0.m_pixels.m_ptr + (long)(int)(local_3b0.m_width * uVar29 + iVar4) * 4) =
               uVar15;
          CVar20 = (ChannelOrder)uVar22 & 0xff;
          CVar18 = local_1b8._0_4_ & 0xff;
          if ((local_1b8._0_4_ & 0xff) < CVar20) {
            CVar18 = CVar20;
          }
          uVar14 = (uint)(uVar22 >> 8) & 0xff;
          uVar5 = (uint)local_1b8._0_4_ >> 8 & 0xff;
          if (uVar5 < uVar14) {
            uVar5 = uVar14;
          }
          uVar21 = (uint)(uVar22 >> 0x10) & 0xff;
          uVar14 = (uint)local_1b8._0_4_ >> 0x10 & 0xff;
          if (uVar14 < uVar21) {
            uVar14 = uVar21;
          }
          uVar26 = (ChannelOrder)uVar22 >> 0x18;
          uVar21 = (uint)local_1b8._0_4_ >> 0x18;
          if ((uint)local_1b8._0_4_ >> 0x18 < uVar26) {
            uVar21 = uVar26;
          }
          uVar22 = (ulong)(uVar14 << 0x10 | uVar5 << 8 | CVar18 | uVar21 << 0x18);
          bVar24 = bVar24 & bVar33;
          uVar32 = uVar32 + 1;
        } while (width != uVar32);
      }
      uVar5 = (uint)uVar22;
      uVar29 = uVar29 + 1;
      lVar27 = lVar27 + (ulong)width;
    } while (uVar29 != height);
  }
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  iVar4 = (int)this_00;
  if (bVar24 == 0) {
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Fail");
    local_1b8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Image comparison failed, max diff = ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"RGBA(",5);
    poVar13 = (ostream *)std::ostream::operator<<((ostringstream *)&uStack_1b0,uVar5 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar5 >> 8 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar5 >> 0x10 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar5 >> 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", threshold = ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"RGBA(",5);
    poVar13 = (ostream *)std::ostream::operator<<((ostringstream *)&uStack_1b0,thr.m_value & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,thr.m_value >> 8 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,thr.m_value >> 0x10 & 0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,thr.m_value >> 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Result","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Resulting framebuffer","")
    ;
    tcu::LogImageSet::LogImageSet(&local_398,&local_4c8,&local_450);
    tcu::TestLog::startImageSet
              (this_00,local_398.m_name._M_dataplus._M_p,local_398.m_description._M_dataplus._M_p);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result","");
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Resulting framebuffer","")
    ;
    pSVar16 = &local_468;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2f8,&local_3d0,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,iVar4,__buf_00,(size_t)pSVar16);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Reference","");
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Reference image","");
    pSVar16 = &local_430;
    tcu::LogImage::LogImage(&local_2d8,&local_318,&local_3f0,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_2d8,iVar4,__buf_01,(size_t)pSVar16);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"DiffMask","");
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Failing pixels","");
    pSVar16 = &local_3b0;
    tcu::LogImage::LogImage(&local_248,&local_338,&local_358,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_248,iVar4,__buf_02,(size_t)pSVar16);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
      operator_delete(local_248.m_description._M_dataplus._M_p,
                      local_248.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
      operator_delete(local_248.m_name._M_dataplus._M_p,
                      local_248.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_description._M_dataplus._M_p != &local_398.m_description.field_2) {
      operator_delete(local_398.m_description._M_dataplus._M_p,
                      local_398.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_name._M_dataplus._M_p != &local_398.m_name.field_2) {
      operator_delete(local_398.m_name._M_dataplus._M_p,
                      local_398.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    IVar17 = STOP;
  }
  else {
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
    iVar10 = this->m_numIters;
    iVar23 = this->m_curIter + 1;
    this->m_curIter = iVar23;
    if (iVar23 == iVar10) {
      local_248.m_name._M_dataplus._M_p = (pointer)&local_248.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Result","");
      paVar1 = &local_398.m_name.field_2;
      local_398.m_name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_398,"Resulting framebuffer","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d8,&local_248.m_name,&local_398.m_name);
      tcu::TestLog::startImageSet
                (this_00,local_2d8.m_name._M_dataplus._M_p,local_2d8.m_description._M_dataplus._M_p)
      ;
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Result","");
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_450,"Resulting framebuffer","");
      pSVar16 = &local_468;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b8,&local_4c8,&local_450,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_1b8,iVar4,__buf,(size_t)pSVar16);
      tcu::TestLog::endImageSet(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != local_188) {
        operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
      }
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
        operator_delete(local_2d8.m_description._M_dataplus._M_p,
                        local_2d8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
        operator_delete(local_2d8.m_name._M_dataplus._M_p,
                        local_2d8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_398.m_name._M_dataplus._M_p,
                        local_398.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
        operator_delete(local_248.m_name._M_dataplus._M_p,
                        local_248.m_name.field_2._M_allocated_capacity + 1);
      }
    }
    IVar17 = (IterateResult)(iVar23 != iVar10);
  }
  if (local_488.
      super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.
                          super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.
                          super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_3b0);
  tcu::Surface::~Surface(&local_468);
  tcu::Surface::~Surface(&local_430);
  if (local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar17;
}

Assistant:

TestCase::IterateResult ColorClearCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	const tcu::PixelFormat&		pixelFormat				= renderTarget.getPixelFormat();
	const int					targetWidth				= renderTarget.getWidth();
	const int					targetHeight			= renderTarget.getHeight();
	const int					numPixels				= targetWidth * targetHeight;

	de::Random					rnd						(deInt32Hash(m_curIter));
	vector<deUint8>				pixelKnownChannelMask	(numPixels, 0);
	Surface						refImage				(targetWidth, targetHeight);
	Surface						resImage				(targetWidth, targetHeight);
	Surface						diffImage				(targetWidth, targetHeight);
	int							numClears				= rnd.getUint32() % (m_numClearsMax + 1 - m_numClearsMin) + m_numClearsMin;
	std::vector<ClearInfo>		clearOps;

	if (m_testScissoring)
		gl.enable(GL_SCISSOR_TEST);

	for (int clearNdx = 0; clearNdx < numClears; clearNdx++)
	{
		// Rectangle.
		int clearX;
		int clearY;
		int clearWidth;
		int clearHeight;
		if (!m_testScissoring || (clearNdx == 0 && m_firstClearFull))
		{
			clearX		= 0;
			clearY		= 0;
			clearWidth	= targetWidth;
			clearHeight	= targetHeight;
		}
		else
		{
			clearX		= (rnd.getUint32() % (2*targetWidth)) - targetWidth;
			clearY		= (rnd.getUint32() % (2*targetHeight)) - targetHeight;
			clearWidth	= (rnd.getUint32() % targetWidth);
			clearHeight	= (rnd.getUint32() % targetHeight);
		}
		gl.scissor(clearX, clearY, clearWidth, clearHeight);

		// Color.
		int		r = (int)(rnd.getUint32() & 0xFF);
		int		g = (int)(rnd.getUint32() & 0xFF);
		int		b = (int)(rnd.getUint32() & 0xFF);
		int		a = m_testAlpha ? (int)(rnd.getUint32() & 0xFF) : 0xFF;
		RGBA	clearCol(r, g, b, a);
		gl.clearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);

		// Mask.
		deUint8	clearMask;
		if (!m_testColorMasks || (clearNdx == 0 && m_firstClearFull))
			clearMask = 0xF;
		else
			clearMask = (rnd.getUint32() & 0xF);
		gl.colorMask((clearMask&0x1) != 0, (clearMask&0x2) != 0, (clearMask&0x4) != 0, (clearMask&0x8) != 0);

		// Clear & store op.
		gl.clear(GL_COLOR_BUFFER_BIT);
		clearOps.push_back(ClearInfo(tcu::IVec4(clearX, clearY, clearWidth, clearHeight), clearMask, clearCol));

		// Let watchdog know we're alive.
		m_testCtx.touchWatchdog();
	}

	// Compute reference image.
	{
		for (int y = 0; y < targetHeight; y++)
		{
			std::vector<ClearInfo>	scanlineClearOps;

			// Find all rectangles affecting this scanline.
			for (int opNdx = 0; opNdx < (int)clearOps.size(); opNdx++)
			{
				ClearInfo& op = clearOps[opNdx];
				if (de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					scanlineClearOps.push_back(op);
			}

			// Compute reference for scanline.
			int x = 0;
			while (x < targetWidth)
			{
				tcu::RGBA	spanColor;
				deUint8		spanKnownMask	= 0;
				int			spanLength		= (targetWidth - x);

				for (int opNdx = (int)scanlineClearOps.size() - 1; opNdx >= 0; opNdx--)
				{
					const ClearInfo& op = scanlineClearOps[opNdx];

					if (de::inBounds(x, op.m_rect.x(), op.m_rect.x()+op.m_rect.z()) &&
						de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					{
						// Compute span length until end of given rectangle.
						spanLength = deMin32(spanLength, op.m_rect.x() + op.m_rect.z() - x);

						tcu::RGBA	clearCol	= op.m_color;
						deUint8		clearMask	= op.m_colorMask;
						if ((clearMask & 0x1) && !(spanKnownMask & 0x1)) spanColor.setRed(clearCol.getRed());
						if ((clearMask & 0x2) && !(spanKnownMask & 0x2)) spanColor.setGreen(clearCol.getGreen());
						if ((clearMask & 0x4) && !(spanKnownMask & 0x4)) spanColor.setBlue(clearCol.getBlue());
						if ((clearMask & 0x8) && !(spanKnownMask & 0x8)) spanColor.setAlpha(clearCol.getAlpha());
						spanKnownMask |= clearMask;

						// Break if have all colors.
						if (spanKnownMask == 0xF)
							break;
					}
					else if (op.m_rect.x() > x)
						spanLength = deMin32(spanLength, op.m_rect.x() - x);
				}

				// Set reference alpha channel to 0xFF, if no alpha in target.
				if (pixelFormat.alphaBits == 0)
					spanColor.setAlpha(0xFF);

				// Fill the span.
				for (int ndx = 0; ndx < spanLength; ndx++)
				{
					refImage.setPixel(x + ndx, y, spanColor);
					pixelKnownChannelMask[y*targetWidth + x + ndx] |= spanKnownMask;
				}

				x += spanLength;
			}
		}
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, resImage.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

	// Compute difference image.
	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	RGBA maxDiff(0, 0, 0, 0);
	bool isImageOk = true;

	if (gl.isEnabled(GL_DITHER))
	{
		colorThreshold.setRed(colorThreshold.getRed() + 1);
		colorThreshold.setGreen(colorThreshold.getGreen() + 1);
		colorThreshold.setBlue(colorThreshold.getBlue() + 1);
		colorThreshold.setAlpha(colorThreshold.getAlpha() + 1);
	}

	for (int y = 0; y < targetHeight; y++)
	for (int x = 0; x < targetWidth; x++)
	{
		int			offset		= (y*targetWidth + x);
		RGBA		refRGBA		= refImage.getPixel(x, y);
		RGBA		resRGBA		= resImage.getPixel(x, y);
		deUint8		colMask		= pixelKnownChannelMask[offset];
		RGBA		diff		= computeAbsDiffMasked(refRGBA, resRGBA, colMask);
		bool		isPixelOk	= diff.isBelowThreshold(colorThreshold);

		diffImage.setPixel(x, y, isPixelOk ? matchColor : diffColor);

		isImageOk	= isImageOk && isPixelOk;
		maxDiff		= max(maxDiff, diff);
	}

	if (isImageOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << tcu::TestLog::Message << "Image comparison failed, max diff = " << maxDiff << ", threshold = " << colorThreshold << tcu::TestLog::EndMessage;

		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
		return TestCase::STOP;
	}

	bool isFinal = (++m_curIter == m_numIters);

	// On final frame, dump images.
	if (isFinal)
	{
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::EndImageSet;
	}

	return isFinal ? TestCase::STOP : TestCase::CONTINUE;
}